

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O1

void __thiscall slang::JsonWriter::endObject(JsonWriter *this)

{
  _Head_base<0UL,_slang::FormatBuffer_*,_false> _Var1;
  size_t sVar2;
  ulong uVar3;
  format_args args;
  string_view fmt;
  char *local_38 [2];
  int local_28;
  
  _Var1._M_head_impl =
       (this->buffer)._M_t.
       super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>._M_t.
       super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>.
       super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
  sVar2 = findLastComma(this);
  if (*(size_t *)((long)&(_Var1._M_head_impl)->buf + 0x10) < sVar2) {
    (**(grow_fun *)((long)&(_Var1._M_head_impl)->buf + 0x18))
              ((buffer<char> *)_Var1._M_head_impl,sVar2);
  }
  uVar3 = *(size_t *)((long)&(_Var1._M_head_impl)->buf + 0x10);
  if (sVar2 < uVar3) {
    uVar3 = sVar2;
  }
  *(ulong *)((long)&(_Var1._M_head_impl)->buf + 8) = uVar3;
  if (this->pretty == true) {
    local_28 = this->currentIndent - this->indentSize;
    this->currentIndent = local_28;
    local_38[0] = "";
    args.field_1.values_ = (value<fmt::v11::context> *)local_38;
    args.desc_ = 0x1c;
    fmt.size_ = 8;
    fmt.data_ = "\n{:{}}}}";
    ::fmt::v11::detail::vformat_to
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt,args,
               (locale_ref)0x0);
    endValue(this);
    return;
  }
  ::fmt::v11::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"},","");
  return;
}

Assistant:

void JsonWriter::endObject() {
    buffer->resize(findLastComma());
    if (pretty) {
        currentIndent -= indentSize;
        buffer->format("\n{:{}}}}", "", currentIndent);
        endValue();
    }
    else {
        buffer->append("},");
    }
}